

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woff2_enc.cc
# Opt level: O3

size_t woff2::anon_unknown_0::ComputeUncompressedLength(Font *font)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  size_t sVar5;
  
  sVar5 = (ulong)font->num_tables << 4 | 0xc;
  for (p_Var4 = (font->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(font->tables)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    if ((((ulong)p_Var4[1]._M_parent & 0x80808080) == 0) &&
       (bVar3 = Font::Table::IsReused((Table *)&p_Var4[1]._M_parent), !bVar3)) {
      uVar1 = *(uint *)((long)&p_Var4[1]._M_left + 4);
      uVar2 = uVar1 + 3 & 0xfffffffc;
      if (0xfffffffc < uVar1) {
        uVar2 = uVar1;
      }
      sVar5 = sVar5 + uVar2;
    }
  }
  return sVar5;
}

Assistant:

size_t ComputeUncompressedLength(const Font& font) {
  // sfnt header + offset table
  size_t size = 12 + 16 * font.num_tables;
  for (const auto& entry : font.tables) {
    const Font::Table& table = entry.second;
    if (table.tag & 0x80808080) continue;  // xform tables don't stay
    if (table.IsReused()) continue;  // don't have to pay twice
    size += Round4(table.length);
  }
  return size;
}